

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_rem_aarch64(float32 a,float32 b,float_status *status)

{
  float32 fVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong local_70;
  long local_68;
  int32_t sigMean;
  uint32_t alternateASig;
  uint64_t q64;
  uint64_t bSig64;
  uint64_t aSig64;
  uint32_t local_38;
  uint32_t q;
  uint32_t bSig;
  uint32_t aSig;
  int expDiff;
  int bExp;
  int aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  float32 local_10;
  float32 b_local;
  float32 a_local;
  
  _aExp = status;
  status_local._4_4_ = b;
  local_10 = a;
  local_10 = float32_squash_input_denormal_aarch64(a,status);
  status_local._4_4_ = float32_squash_input_denormal_aarch64(status_local._4_4_,_aExp);
  q = extractFloat32Frac(local_10);
  expDiff = extractFloat32Exp(local_10);
  bExp._3_1_ = extractFloat32Sign(local_10);
  local_38 = extractFloat32Frac(status_local._4_4_);
  aSig = extractFloat32Exp(status_local._4_4_);
  if (expDiff == 0xff) {
    if ((q == 0) && ((aSig != 0xff || (local_38 == 0)))) {
      float_raise_aarch64('\x01',_aExp);
      b_local = float32_default_nan_aarch64(_aExp);
    }
    else {
      b_local = propagateFloat32NaN(local_10,status_local._4_4_,_aExp);
    }
  }
  else if (aSig == 0xff) {
    if (local_38 == 0) {
      b_local = local_10;
    }
    else {
      b_local = propagateFloat32NaN(local_10,status_local._4_4_,_aExp);
    }
  }
  else {
    if (aSig == 0) {
      if (local_38 == 0) {
        float_raise_aarch64('\x01',_aExp);
        fVar1 = float32_default_nan_aarch64(_aExp);
        return fVar1;
      }
      normalizeFloat32Subnormal(local_38,(int *)&aSig,&local_38);
    }
    if (expDiff == 0) {
      if (q == 0) {
        return local_10;
      }
      normalizeFloat32Subnormal(q,&expDiff,&q);
    }
    bSig = expDiff - aSig;
    q = q | 0x800000;
    local_38 = local_38 | 0x800000;
    if ((int)bSig < 0x20) {
      q = q << 8;
      uVar2 = local_38 * 0x100;
      if ((int)bSig < 0) {
        if ((int)bSig < -1) {
          return local_10;
        }
        q = q >> 1;
      }
      aSig64._4_4_ = (uint)(uVar2 <= q);
      if (aSig64._4_4_ != 0) {
        q = q + local_38 * -0x100;
      }
      if ((int)bSig < 1) {
        q = q >> 2;
      }
      else {
        aSig64._4_4_ = SUB164((ZEXT416(q) << 0x20) / ZEXT416(uVar2),0) >>
                       (0x20U - (char)bSig & 0x1f);
        q = ((q >> 1) << ((char)bSig - 1U & 0x1f)) - (uVar2 >> 2) * aSig64._4_4_;
      }
      local_38 = uVar2 >> 2;
      uVar3 = q;
    }
    else {
      if (local_38 <= q) {
        q = q - local_38;
      }
      bSig64 = (ulong)q << 0x28;
      uVar4 = (ulong)local_38;
      for (bSig = bSig - 0x40; 0 < (int)bSig; bSig = bSig - 0x3e) {
        uVar5 = estimateDiv128To64(bSig64,0,uVar4 << 0x28);
        if (uVar5 < 3) {
          local_68 = 0;
        }
        else {
          local_68 = uVar5 - 2;
        }
        bSig64 = -((ulong)local_38 * local_68 << 0x26);
      }
      bSig = bSig + 0x40;
      uVar5 = estimateDiv128To64(bSig64,0,uVar4 << 0x28);
      if (uVar5 < 3) {
        local_70 = 0;
      }
      else {
        local_70 = uVar5 - 2;
      }
      aSig64._4_4_ = (uint)(local_70 >> (0x40U - (char)bSig & 0x3f));
      local_38 = local_38 * 0x40;
      uVar3 = (int)((bSig64 >> 0x21) << ((char)bSig - 1U & 0x3f)) - local_38 * aSig64._4_4_;
    }
    do {
      q = uVar3;
      aSig64._4_4_ = aSig64._4_4_ + 1;
      uVar3 = q - local_38;
    } while (-1 < (int)uVar3);
    if (((int)(uVar3 + q) < 0) || ((uVar3 + q == 0 && ((aSig64._4_4_ & 1) != 0)))) {
      uVar3 = q;
    }
    q = uVar3;
    bExp._2_1_ = (int)q < 0;
    if ((bool)bExp._2_1_) {
      q = -q;
    }
    b_local = normalizeRoundAndPackFloat32(bExp._3_1_ ^ bExp._2_1_,aSig,q,_aExp);
  }
  return b_local;
}

Assistant:

float32 float32_rem(float32 a, float32 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint32_t aSig, bSig;
    uint32_t q;
    uint64_t aSig64, bSig64, q64;
    uint32_t alternateASig;
    int32_t sigMean;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    bSig = extractFloat32Frac( b );
    bExp = extractFloat32Exp( b );
    if ( aExp == 0xFF ) {
        if ( aSig || ( ( bExp == 0xFF ) && bSig ) ) {
            return propagateFloat32NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( bExp == 0xFF ) {
        if (bSig) {
            return propagateFloat32NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float32_default_nan(status);
        }
        normalizeFloat32Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig |= 0x00800000;
    bSig |= 0x00800000;
    if ( expDiff < 32 ) {
        aSig <<= 8;
        bSig <<= 8;
        if ( expDiff < 0 ) {
            if ( expDiff < -1 ) return a;
            aSig >>= 1;
        }
        q = ( bSig <= aSig );
        if ( q ) aSig -= bSig;
        if ( 0 < expDiff ) {
            q = ( ( (uint64_t) aSig )<<32 ) / bSig;
            q >>= 32 - expDiff;
            bSig >>= 2;
            aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
        }
        else {
            aSig >>= 2;
            bSig >>= 2;
        }
    }
    else {
        if ( bSig <= aSig ) aSig -= bSig;
        aSig64 = ( (uint64_t) aSig )<<40;
        bSig64 = ( (uint64_t) bSig )<<40;
        expDiff -= 64;
        while ( 0 < expDiff ) {
            q64 = estimateDiv128To64( aSig64, 0, bSig64 );
            q64 = ( 2 < q64 ) ? q64 - 2 : 0;
#ifdef _MSC_VER
            aSig64 = 0ULL - ( ( bSig * q64 )<<38 );
#else
            aSig64 = - ( ( bSig * q64 )<<38 );
#endif
            expDiff -= 62;
        }
        expDiff += 64;
        q64 = estimateDiv128To64( aSig64, 0, bSig64 );
        q64 = ( 2 < q64 ) ? q64 - 2 : 0;
        q = q64>>( 64 - expDiff );
        bSig <<= 6;
        aSig = ( ( aSig64>>33 )<<( expDiff - 1 ) ) - bSig * q;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int32_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int32_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0ULL - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat32(aSign ^ zSign, bExp, aSig, status);
}